

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  int *piVar16;
  double *pdVar17;
  uint uVar18;
  double *pdVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  double *pdVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  double *pdVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  if (0 < partitionCount) {
    uVar24 = 0;
    do {
      iVar5 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar24]];
      lVar22 = (long)iVar5;
      iVar6 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar24] + 1];
      lVar25 = (long)iVar6;
      memset(this->integrationTmp + this->kStateCount * iVar5,0,
             (long)((iVar6 - iVar5) * this->kStateCount) << 3);
      iVar23 = childBufferIndices[uVar24];
      iVar7 = cumulativeScaleIndices[uVar24];
      pdVar12 = this->gTransitionMatrices[probabilityIndices[uVar24]];
      pdVar13 = this->gCategoryWeights[categoryWeightsIndices[uVar24]];
      pdVar14 = this->gStateFrequencies[stateFrequenciesIndices[uVar24]];
      pdVar15 = this->gPartials[parentBufferIndices[uVar24]];
      if ((iVar23 < this->kTipCount) && (piVar16 = this->gTipStates[iVar23], piVar16 != (int *)0x0))
      {
        iVar23 = this->kCategoryCount;
        if (0 < (long)iVar23) {
          iVar8 = this->kPartialsPaddedStateCount;
          uVar9 = this->kStateCount;
          iVar10 = this->kMatrixSize;
          iVar11 = this->kPatternCount;
          iVar31 = iVar8 * iVar5;
          lVar36 = 0;
          iVar29 = 0;
          do {
            if (iVar5 < iVar6) {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = pdVar13[lVar36];
              pdVar37 = this->integrationTmp;
              iVar26 = this->kTransPaddedStateCount;
              lVar32 = (long)iVar31;
              pdVar28 = pdVar15 + lVar32;
              lVar27 = lVar22;
              iVar21 = uVar9 * iVar5;
              do {
                if (0 < (int)uVar9) {
                  pdVar19 = pdVar12 + (long)iVar29 + (long)piVar16[lVar27];
                  uVar30 = 0;
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar37[(long)iVar21 + uVar30];
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = *pdVar19 * pdVar28[uVar30];
                    auVar40 = vfmadd213sd_fma(auVar42,auVar39,auVar1);
                    pdVar37[(long)iVar21 + uVar30] = auVar40._0_8_;
                    uVar30 = uVar30 + 1;
                    pdVar19 = pdVar19 + iVar26;
                  } while (uVar9 != uVar30);
                  iVar21 = iVar21 + (int)uVar30;
                }
                lVar32 = lVar32 + iVar8;
                iVar31 = (int)lVar32;
                lVar27 = lVar27 + 1;
                pdVar28 = pdVar28 + iVar8;
              } while (lVar27 != lVar25);
            }
            iVar31 = iVar31 + ((iVar5 - iVar6) + iVar11) * iVar8;
            lVar36 = lVar36 + 1;
            iVar29 = iVar29 + iVar10;
          } while (lVar36 != iVar23);
        }
      }
      else {
        iVar8 = this->kCategoryCount;
        if (0 < (long)iVar8) {
          pdVar28 = this->gPartials[iVar23];
          uVar9 = this->kStateCount;
          uVar18 = uVar9 + 3;
          if (-1 < (int)uVar9) {
            uVar18 = uVar9;
          }
          iVar23 = this->kPartialsPaddedStateCount;
          lVar36 = (long)iVar23;
          iVar10 = this->kMatrixSize;
          iVar11 = this->kPatternCount;
          uVar34 = iVar23 * iVar5;
          iVar29 = 0;
          lVar27 = 0;
          do {
            uVar30 = (ulong)uVar34;
            if (iVar5 < iVar6) {
              auVar40._8_8_ = 0;
              auVar40._0_8_ = pdVar13[lVar27];
              pdVar17 = this->integrationTmp;
              uVar30 = (ulong)(int)uVar34;
              pdVar37 = pdVar28 + uVar30 + 2;
              pdVar19 = pdVar28 + uVar30;
              uVar33 = (ulong)(uVar9 * iVar5);
              iVar31 = iVar5;
              do {
                if (0 < (int)uVar9) {
                  uVar33 = (ulong)(int)uVar33;
                  uVar35 = 0;
                  iVar26 = iVar29;
                  do {
                    if ((int)uVar9 < 4) {
                      uVar20 = 0;
                      auVar43 = ZEXT816(0);
                    }
                    else {
                      auVar43 = ZEXT816(0);
                      uVar20 = 0;
                      do {
                        auVar43 = vfmadd231pd_fma(auVar43,*(undefined1 (*) [16])
                                                           (pdVar12 + (long)iVar26 + uVar20),
                                                  *(undefined1 (*) [16])(pdVar37 + (uVar20 - 2)));
                        auVar43 = vfmadd231pd_fma(auVar43,*(undefined1 (*) [16])
                                                           (pdVar12 + (long)iVar26 + uVar20 + 2),
                                                  *(undefined1 (*) [16])(pdVar37 + uVar20));
                        uVar20 = uVar20 + 4;
                      } while ((long)uVar20 < (long)(int)(uVar18 & 0xfffffffc));
                    }
                    dVar38 = auVar43._0_8_;
                    if ((int)uVar20 < (int)uVar9) {
                      uVar20 = uVar20 & 0xffffffff;
                      auVar39 = auVar43;
                      do {
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = pdVar12[(long)iVar26 + uVar20];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar19[uVar20];
                        auVar39 = vfmadd231sd_fma(auVar39,auVar47,auVar2);
                        dVar38 = auVar39._0_8_;
                        uVar20 = uVar20 + 1;
                      } while (uVar9 != uVar20);
                    }
                    auVar39 = vshufpd_avx(auVar43,auVar43,1);
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = pdVar17[uVar33];
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = (auVar39._0_8_ + dVar38) * pdVar15[uVar30 + uVar35];
                    auVar43 = vfmadd213sd_fma(auVar44,auVar40,auVar43);
                    pdVar17[uVar33] = auVar43._0_8_;
                    uVar33 = uVar33 + 1;
                    uVar35 = uVar35 + 1;
                    iVar26 = iVar26 + uVar9 + 1;
                  } while (uVar35 != uVar9);
                }
                uVar30 = uVar30 + lVar36;
                iVar31 = iVar31 + 1;
                pdVar37 = pdVar37 + lVar36;
                pdVar19 = pdVar19 + lVar36;
              } while (iVar31 != iVar6);
            }
            uVar34 = (int)uVar30 + ((iVar5 - iVar6) + iVar11) * iVar23;
            lVar27 = lVar27 + 1;
            iVar29 = iVar29 + iVar10;
          } while (lVar27 != iVar8);
        }
      }
      if (iVar5 < iVar6) {
        iVar23 = this->kStateCount * iVar5;
        lVar36 = lVar22;
        do {
          iVar8 = this->kStateCount;
          if ((long)iVar8 < 1) {
            dVar38 = 0.0;
          }
          else {
            auVar40 = ZEXT816(0);
            lVar27 = 0;
            do {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = pdVar14[lVar27];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = this->integrationTmp[iVar23 + lVar27];
              auVar40 = vfmadd231sd_fma(auVar40,auVar45,auVar3);
              dVar38 = auVar40._0_8_;
              lVar27 = lVar27 + 1;
            } while (iVar8 != lVar27);
            iVar23 = iVar23 + iVar8;
          }
          dVar38 = log(dVar38);
          this->outLogLikelihoodsTmp[lVar36] = dVar38;
          lVar36 = lVar36 + 1;
        } while (lVar36 != lVar25);
      }
      if ((iVar7 != -1) && (iVar5 < iVar6)) {
        pdVar12 = this->gScaleBuffers[iVar7];
        pdVar13 = this->outLogLikelihoodsTmp;
        lVar36 = lVar22;
        do {
          pdVar13[lVar36] = pdVar12[lVar36] + pdVar13[lVar36];
          lVar36 = lVar36 + 1;
        } while (lVar25 != lVar36);
      }
      outSumLogLikelihoodByPartition[uVar24] = 0.0;
      if (iVar5 < iVar6) {
        pdVar12 = this->gPatternWeights;
        pdVar13 = this->outLogLikelihoodsTmp;
        auVar41 = ZEXT864((ulong)outSumLogLikelihoodByPartition[uVar24]);
        do {
          auVar46._8_8_ = 0;
          auVar46._0_8_ = pdVar13[lVar22];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pdVar12[lVar22];
          auVar40 = vfmadd231sd_fma(auVar41._0_16_,auVar46,auVar4);
          auVar41 = ZEXT1664(auVar40);
          outSumLogLikelihoodByPartition[uVar24] = auVar40._0_8_;
          lVar22 = lVar22 + 1;
        } while (lVar25 != lVar22);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child
            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
                        //                        for(int j = 0; j < kStateCount; j++) {
                        //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                        //                            w++;
                        //                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}